

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void sysbvm_context_registerPrimitives(void)

{
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_identityEquals,"==");
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_identityNotEquals,"~~");
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_identityHash,"identityHash");
  sysbvm_primitiveTable_registerFunction(sysbvm_string_primitive_equals,"String::=");
  sysbvm_primitiveTable_registerFunction(sysbvm_string_primitive_hash,"String::hash");
  sysbvm_array_registerPrimitives();
  sysbvm_orderedCollection_registerPrimitives();
  sysbvm_astInterpreter_registerPrimitives();
  sysbvm_boolean_registerPrimitives();
  sysbvm_bytecode_registerPrimitives();
  sysbvm_functionBytecodeDirectCompiler_registerPrimitives();
  sysbvm_byteStream_registerPrimitives();
  sysbvm_dictionary_registerPrimitives();
  sysbvm_errors_registerPrimitives();
  sysbvm_environment_registerPrimitives();
  sysbvm_exceptions_registerPrimitives();
  sysbvm_filesystem_registerPrimitives();
  sysbvm_float_registerPrimitives();
  sysbvm_function_registerPrimitives();
  sysbvm_integer_registerPrimitives();
  sysbvm_io_registerPrimitives();
  sysbvm_primitiveInteger_registerPrimitives();
  sysbvm_programEntity_registerPrimitives();
  sysbvm_set_registerPrimitives();
  sysbvm_sourcePosition_registerPrimitives();
  sysbvm_string_registerPrimitives();
  sysbvm_stringStream_registerPrimitives();
  sysbvm_time_registerPrimitives();
  sysbvm_tuple_registerPrimitives();
  sysbvm_type_registerPrimitives();
  return;
}

Assistant:

void sysbvm_context_registerPrimitives(void)
{
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_identityEquals, "==");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_identityNotEquals, "~~");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_identityHash, "identityHash");
    sysbvm_primitiveTable_registerFunction(sysbvm_string_primitive_equals, "String::=");
    sysbvm_primitiveTable_registerFunction(sysbvm_string_primitive_hash, "String::hash");

    sysbvm_array_registerPrimitives();
    sysbvm_orderedCollection_registerPrimitives();
    sysbvm_astInterpreter_registerPrimitives();
    sysbvm_boolean_registerPrimitives();
    sysbvm_bytecode_registerPrimitives();
    sysbvm_functionBytecodeDirectCompiler_registerPrimitives();
    sysbvm_byteStream_registerPrimitives();
    sysbvm_dictionary_registerPrimitives();
    sysbvm_errors_registerPrimitives();
    sysbvm_environment_registerPrimitives();
    sysbvm_exceptions_registerPrimitives();
    sysbvm_filesystem_registerPrimitives();
    sysbvm_float_registerPrimitives();
    sysbvm_function_registerPrimitives();
    sysbvm_integer_registerPrimitives();
    sysbvm_io_registerPrimitives();
    sysbvm_primitiveInteger_registerPrimitives();
    sysbvm_programEntity_registerPrimitives();
    sysbvm_set_registerPrimitives();
    sysbvm_sourcePosition_registerPrimitives();
    sysbvm_string_registerPrimitives();
    sysbvm_stringStream_registerPrimitives();
    sysbvm_time_registerPrimitives();
    sysbvm_tuple_registerPrimitives();
    sysbvm_type_registerPrimitives();
}